

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extra_operator_info.hpp
# Opt level: O2

void __thiscall
duckdb::ExtraOperatorInfo::ExtraOperatorInfo(ExtraOperatorInfo *this,ExtraOperatorInfo *extra_info)

{
  idx_t in_RAX;
  idx_t iVar1;
  optional_idx local_18;
  
  local_18.index = in_RAX;
  ::std::__cxx11::string::string((string *)this,(string *)extra_info);
  *(undefined4 *)&(this->total_files).index = 0xffffffff;
  *(undefined4 *)((long)&(this->total_files).index + 4) = 0xffffffff;
  *(undefined4 *)&(this->filtered_files).index = 0xffffffff;
  *(undefined4 *)((long)&(this->filtered_files).index + 4) = 0xffffffff;
  (this->sample_options).
  super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
  super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>.
  super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl =
       (extra_info->sample_options).
       super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
       super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>.
       super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl;
  (extra_info->sample_options).
  super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
  super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>.
  super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl = (SampleOptions *)0x0;
  if ((extra_info->total_files).index != 0xffffffffffffffff) {
    iVar1 = optional_idx::GetIndex(&extra_info->total_files);
    optional_idx::optional_idx(&local_18,iVar1);
    (this->total_files).index = local_18.index;
  }
  if ((extra_info->filtered_files).index != 0xffffffffffffffff) {
    iVar1 = optional_idx::GetIndex(&extra_info->filtered_files);
    optional_idx::optional_idx(&local_18,iVar1);
    (this->filtered_files).index = local_18.index;
  }
  return;
}

Assistant:

ExtraOperatorInfo(ExtraOperatorInfo &extra_info)
	    : file_filters(extra_info.file_filters), sample_options(std::move(extra_info.sample_options)) {
		if (extra_info.total_files.IsValid()) {
			total_files = extra_info.total_files.GetIndex();
		}
		if (extra_info.filtered_files.IsValid()) {
			filtered_files = extra_info.filtered_files.GetIndex();
		}
	}